

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_3,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> *in_RCX;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> local_78;
  undefined8 local_68;
  float local_60 [6];
  float local_48 [2];
  undefined8 local_40;
  undefined4 local_38;
  Matrix<float,_3,_3> local_2c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_60[0] = (evalCtx->coords).m_data[2];
    local_68 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_68 = 0x3dcccccd3f8ccccd;
    local_60[0] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data[2] = (evalCtx->coords).m_data[2];
    local_78.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_78.m_data[0] = -0.2;
    local_78.m_data[1] = 0.5;
    local_78.m_data[2] = 0.8;
  }
  outerProduct<float,3,3>(&local_2c,(MatrixCaseUtils *)&local_68,&local_78,in_RCX);
  local_40 = (ulong)local_40._4_4_ << 0x20;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  lVar1 = 0;
  do {
    local_48[lVar1] =
         local_2c.m_data.m_data[0].m_data[lVar1] + local_2c.m_data.m_data[1].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_60[4] = 0.0;
  local_60[2] = 0.0;
  local_60[3] = 0.0;
  lVar1 = 0;
  do {
    local_60[lVar1 + 2] = local_48[lVar1] + local_2c.m_data.m_data[2].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_40 = 0x100000000;
  local_38 = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_48[lVar1]] = local_60[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}